

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int decodeFlags(MemPage *pPage,int flagByte)

{
  BtShared *pBVar1;
  undefined4 uVar2;
  code *pcVar3;
  undefined8 uVar4;
  
  pBVar1 = pPage->pBt;
  pPage->max1bytePayload = pBVar1->max1bytePayload;
  if (flagByte < 10) {
    pPage->childPtrSize = '\x04';
    pPage->leaf = '\0';
    if (flagByte == 5) {
      pPage->xCellSize = cellSizePtrNoPayload;
      pPage->xParseCell = btreeParseCellPtrNoPayload;
      pPage->intKey = '\x01';
      pPage->intKeyLeaf = '\0';
      goto LAB_0013c69d;
    }
    if (flagByte != 2) {
      pPage->intKey = '\0';
      pPage->intKeyLeaf = '\0';
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      uVar4 = 0x11c98;
      goto LAB_0013c732;
    }
    pPage->intKey = '\0';
    pPage->intKeyLeaf = '\0';
    pcVar3 = cellSizePtr;
  }
  else {
    pPage->childPtrSize = '\0';
    pPage->leaf = '\x01';
    if (flagByte != 10) {
      if (flagByte != 0xd) {
        pPage->intKey = '\0';
        pPage->intKeyLeaf = '\0';
        pPage->xCellSize = cellSizePtrIdxLeaf;
        pPage->xParseCell = btreeParseCellPtrIndex;
        uVar4 = 0x11c80;
LAB_0013c732:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar4,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        return 0xb;
      }
      pPage->xCellSize = cellSizePtrTableLeaf;
      pPage->xParseCell = btreeParseCellPtr;
      pPage->intKey = '\x01';
      pPage->intKeyLeaf = '\x01';
LAB_0013c69d:
      uVar2._0_2_ = pBVar1->maxLeaf;
      uVar2._2_2_ = pBVar1->minLeaf;
      goto LAB_0013c6a0;
    }
    pPage->intKey = '\0';
    pPage->intKeyLeaf = '\0';
    pcVar3 = cellSizePtrIdxLeaf;
  }
  pPage->xCellSize = pcVar3;
  pPage->xParseCell = btreeParseCellPtrIndex;
  uVar2._0_2_ = pBVar1->maxLocal;
  uVar2._2_2_ = pBVar1->minLocal;
LAB_0013c6a0:
  pPage->maxLocal = (short)uVar2;
  pPage->minLocal = (short)((uint)uVar2 >> 0x10);
  return 0;
}

Assistant:

static int decodeFlags(MemPage *pPage, int flagByte){
  BtShared *pBt;     /* A copy of pPage->pBt */

  assert( pPage->hdrOffset==(pPage->pgno==1 ? 100 : 0) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pBt = pPage->pBt;
  pPage->max1bytePayload = pBt->max1bytePayload;
  if( flagByte>=(PTF_ZERODATA | PTF_LEAF) ){
    pPage->childPtrSize = 0;
    pPage->leaf = 1;
    if( flagByte==(PTF_LEAFDATA | PTF_INTKEY | PTF_LEAF) ){
      pPage->intKeyLeaf = 1;
      pPage->xCellSize = cellSizePtrTableLeaf;
      pPage->xParseCell = btreeParseCellPtr;
      pPage->intKey = 1;
      pPage->maxLocal = pBt->maxLeaf;
      pPage->minLocal = pBt->minLeaf;
    }else if( flagByte==(PTF_ZERODATA | PTF_LEAF) ){
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrIdxLeaf;
      pPage->xParseCell = btreeParseCellPtrIndex;
      pPage->maxLocal = pBt->maxLocal;
      pPage->minLocal = pBt->minLocal;
    }else{
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrIdxLeaf;
      pPage->xParseCell = btreeParseCellPtrIndex;
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }else{
    pPage->childPtrSize = 4;
    pPage->leaf = 0;
    if( flagByte==(PTF_ZERODATA) ){
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      pPage->maxLocal = pBt->maxLocal;
      pPage->minLocal = pBt->minLocal;
    }else if( flagByte==(PTF_LEAFDATA | PTF_INTKEY) ){
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrNoPayload;
      pPage->xParseCell = btreeParseCellPtrNoPayload;
      pPage->intKey = 1;
      pPage->maxLocal = pBt->maxLeaf;
      pPage->minLocal = pBt->minLeaf;
    }else{
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }
  return SQLITE_OK;
}